

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float fVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  
  pBVar7 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  pcVar8 = (pBVar7->super_RawBufferView).ptr_ofs;
  sVar9 = (pBVar7->super_RawBufferView).stride;
  uVar6 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  lVar21 = sVar9 * uVar6;
  fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar12 = fVar1 * *(float *)(pcVar8 + lVar21 + 0xc);
  auVar45._4_4_ = fVar12;
  auVar45._0_4_ = fVar12;
  auVar45._8_4_ = fVar12;
  auVar45._12_4_ = fVar12;
  auVar33._16_4_ = fVar12;
  auVar33._0_16_ = auVar45;
  auVar33._20_4_ = fVar12;
  auVar33._24_4_ = fVar12;
  auVar33._28_4_ = fVar12;
  pBVar7 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar10 = (pBVar7->super_RawBufferView).ptr_ofs;
  sVar11 = (pBVar7->super_RawBufferView).stride;
  lVar22 = uVar6 * sVar11;
  aVar3 = (space->vx).field_0;
  aVar4 = (space->vy).field_0;
  aVar5 = (space->vz).field_0;
  uVar2 = *(undefined4 *)(pcVar10 + lVar22 + 8);
  auVar23._4_4_ = uVar2;
  auVar23._0_4_ = uVar2;
  auVar23._8_4_ = uVar2;
  auVar23._12_4_ = uVar2;
  auVar23 = vmulps_avx512vl((undefined1  [16])aVar5,auVar23);
  uVar2 = *(undefined4 *)(pcVar10 + lVar22 + 4);
  auVar24._4_4_ = uVar2;
  auVar24._0_4_ = uVar2;
  auVar24._8_4_ = uVar2;
  auVar24._12_4_ = uVar2;
  auVar23 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar4,auVar24);
  uVar2 = *(undefined4 *)(pcVar10 + lVar22);
  auVar13._4_4_ = uVar2;
  auVar13._0_4_ = uVar2;
  auVar13._8_4_ = uVar2;
  auVar13._12_4_ = uVar2;
  auVar23 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar3,auVar13);
  uVar2 = *(undefined4 *)(pcVar8 + lVar21 + 8);
  auVar25._4_4_ = uVar2;
  auVar25._0_4_ = uVar2;
  auVar25._8_4_ = uVar2;
  auVar25._12_4_ = uVar2;
  auVar24 = vmulps_avx512vl((undefined1  [16])aVar5,auVar25);
  auVar23 = vinsertps_avx(auVar23,ZEXT416((uint)(fVar1 * *(float *)(pcVar10 + lVar22 + 0xc))),0x30);
  uVar2 = *(undefined4 *)(pcVar8 + lVar21 + 4);
  auVar26._4_4_ = uVar2;
  auVar26._0_4_ = uVar2;
  auVar26._8_4_ = uVar2;
  auVar26._12_4_ = uVar2;
  auVar24 = vfmadd231ps_avx512vl(auVar24,(undefined1  [16])aVar4,auVar26);
  uVar2 = *(undefined4 *)(pcVar8 + lVar21);
  auVar14._4_4_ = uVar2;
  auVar14._0_4_ = uVar2;
  auVar14._8_4_ = uVar2;
  auVar14._12_4_ = uVar2;
  auVar25 = vfmadd231ps_avx512vl(auVar24,(undefined1  [16])aVar3,auVar14);
  auVar24 = vinsertps_avx(auVar25,auVar45,0x30);
  auVar54._8_4_ = 0xbeaaaaab;
  auVar54._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar54._12_4_ = 0xbeaaaaab;
  auVar31._8_4_ = 3;
  auVar31._0_8_ = 0x300000003;
  auVar31._12_4_ = 3;
  auVar31._16_4_ = 3;
  auVar31._20_4_ = 3;
  auVar31._24_4_ = 3;
  auVar31._28_4_ = 3;
  auVar13 = vfnmadd231ps_fma(auVar24,auVar54,auVar23);
  lVar21 = sVar11 * (uVar6 + 1);
  uVar2 = *(undefined4 *)(pcVar10 + lVar21 + 8);
  auVar15._4_4_ = uVar2;
  auVar15._0_4_ = uVar2;
  auVar15._8_4_ = uVar2;
  auVar15._12_4_ = uVar2;
  auVar23 = vmulps_avx512vl((undefined1  [16])aVar5,auVar15);
  uVar2 = *(undefined4 *)(pcVar10 + lVar21 + 4);
  auVar16._4_4_ = uVar2;
  auVar16._0_4_ = uVar2;
  auVar16._8_4_ = uVar2;
  auVar16._12_4_ = uVar2;
  auVar23 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar4,auVar16);
  auVar32 = vpermps_avx2(auVar31,ZEXT1632(auVar13));
  uVar2 = *(undefined4 *)(pcVar10 + lVar21);
  auVar17._4_4_ = uVar2;
  auVar17._0_4_ = uVar2;
  auVar17._8_4_ = uVar2;
  auVar17._12_4_ = uVar2;
  auVar23 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar3,auVar17);
  lVar22 = sVar9 * (uVar6 + 1);
  uVar2 = *(undefined4 *)(pcVar8 + lVar22 + 8);
  auVar18._4_4_ = uVar2;
  auVar18._0_4_ = uVar2;
  auVar18._8_4_ = uVar2;
  auVar18._12_4_ = uVar2;
  auVar24 = vmulps_avx512vl((undefined1  [16])aVar5,auVar18);
  uVar2 = *(undefined4 *)(pcVar8 + lVar22 + 4);
  auVar19._4_4_ = uVar2;
  auVar19._0_4_ = uVar2;
  auVar19._8_4_ = uVar2;
  auVar19._12_4_ = uVar2;
  auVar24 = vfmadd231ps_avx512vl(auVar24,(undefined1  [16])aVar4,auVar19);
  uVar2 = *(undefined4 *)(pcVar8 + lVar22);
  auVar20._4_4_ = uVar2;
  auVar20._0_4_ = uVar2;
  auVar20._8_4_ = uVar2;
  auVar20._12_4_ = uVar2;
  auVar26 = vfmadd231ps_avx512vl(auVar24,(undefined1  [16])aVar3,auVar20);
  auVar23 = vinsertps_avx(auVar23,ZEXT416((uint)(fVar1 * *(float *)(pcVar10 + lVar21 + 0xc))),0x30);
  auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * *(float *)(pcVar8 + lVar22 + 0xc))));
  auVar24 = vinsertps_avx512f(auVar26,auVar27._0_16_,0x30);
  auVar23 = vfmadd231ps_fma(auVar24,auVar54,auVar23);
  auVar31 = vpermps_avx2(auVar31,ZEXT1632(auVar23));
  auVar28 = vmulps_avx512vl(auVar27,bezier_basis0._3944_32_);
  auVar24 = vfmadd231ps_fma(auVar28,bezier_basis0._2788_32_,auVar31);
  auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),bezier_basis0._1632_32_,auVar32);
  auVar28 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),bezier_basis0._476_32_,auVar33);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar30 = vmaxps_avx512vl(auVar29,auVar28);
  auVar27 = vmulps_avx512vl(auVar27,bezier_basis0._8568_32_);
  auVar31 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._7412_32_,auVar31);
  auVar32 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._6256_32_,auVar32);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._5100_32_,auVar33);
  auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar33 = vmulps_avx512vl(auVar32,auVar31);
  auVar32 = vblendps_avx(auVar33,ZEXT432(0) << 0x20,1);
  auVar27 = vsubps_avx(auVar28,auVar32);
  auVar32 = vblendps_avx(auVar33,ZEXT432(0) << 0x20,0x80);
  auVar33 = vaddps_avx512vl(auVar28,auVar32);
  auVar32 = vmaxps_avx512vl(auVar27,auVar33);
  auVar34 = vmaxps_avx512vl(auVar30,auVar32);
  auVar37._8_4_ = 2;
  auVar37._0_8_ = 0x200000002;
  auVar37._12_4_ = 2;
  auVar37._16_4_ = 2;
  auVar37._20_4_ = 2;
  auVar37._24_4_ = 2;
  auVar37._28_4_ = 2;
  auVar30 = vpermps_avx512vl(auVar37,ZEXT1632(auVar25));
  auVar35 = vpermps_avx512vl(auVar37,ZEXT1632(auVar13));
  auVar36 = vpermps_avx512vl(auVar37,ZEXT1632(auVar23));
  auVar32 = vpermps_avx2(auVar37,ZEXT1632(auVar26));
  auVar37 = vmulps_avx512vl(auVar32,bezier_basis0._3944_32_);
  auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._2788_32_,auVar36);
  auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._1632_32_,auVar35);
  auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._476_32_,auVar30);
  auVar38 = vmaxps_avx512vl(auVar29,auVar37);
  auVar32 = vmulps_avx512vl(auVar32,bezier_basis0._8568_32_);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._7412_32_,auVar36);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._6256_32_,auVar35);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._5100_32_,auVar30);
  auVar30 = vmulps_avx512vl(auVar32,auVar31);
  auVar43 = ZEXT432(0) << 0x20;
  auVar32 = vblendps_avx(auVar30,auVar43,1);
  auVar35 = vsubps_avx512vl(auVar37,auVar32);
  auVar32 = vblendps_avx(auVar30,auVar43,0x80);
  auVar36 = vaddps_avx512vl(auVar37,auVar32);
  auVar32 = vmaxps_avx512vl(auVar35,auVar36);
  auVar38 = vmaxps_avx512vl(auVar38,auVar32);
  auVar32 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar30 = vpermps_avx512vl(auVar32,ZEXT1632(auVar25));
  auVar39 = vpermps_avx512vl(auVar32,ZEXT1632(auVar13));
  auVar40 = vpermps_avx512vl(auVar32,ZEXT1632(auVar23));
  auVar32 = vpermps_avx512vl(auVar32,ZEXT1632(auVar26));
  auVar41 = vmulps_avx512vl(auVar32,bezier_basis0._3944_32_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._2788_32_,auVar40);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._1632_32_,auVar39);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._476_32_,auVar30);
  auVar42 = vmaxps_avx512vl(auVar29,auVar41);
  auVar32 = vmulps_avx512vl(auVar32,bezier_basis0._8568_32_);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._7412_32_,auVar40);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._6256_32_,auVar39);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._5100_32_,auVar30);
  auVar30 = vmulps_avx512vl(auVar32,auVar31);
  auVar32 = vblendps_avx(auVar30,auVar43,1);
  auVar39 = vsubps_avx512vl(auVar41,auVar32);
  auVar32 = vblendps_avx(auVar30,auVar43,0x80);
  auVar40 = vaddps_avx512vl(auVar41,auVar32);
  auVar32 = vmaxps_avx512vl(auVar39,auVar40);
  auVar42 = vmaxps_avx512vl(auVar42,auVar32);
  auVar30._0_4_ = auVar25._0_4_;
  auVar30._4_4_ = auVar30._0_4_;
  auVar30._8_4_ = auVar30._0_4_;
  auVar30._12_4_ = auVar30._0_4_;
  auVar30._16_4_ = auVar30._0_4_;
  auVar30._20_4_ = auVar30._0_4_;
  auVar30._24_4_ = auVar30._0_4_;
  auVar30._28_4_ = auVar30._0_4_;
  auVar51._0_4_ = auVar13._0_4_;
  auVar51._4_4_ = auVar51._0_4_;
  auVar51._8_4_ = auVar51._0_4_;
  auVar51._12_4_ = auVar51._0_4_;
  auVar51._16_4_ = auVar51._0_4_;
  auVar51._20_4_ = auVar51._0_4_;
  auVar51._24_4_ = auVar51._0_4_;
  auVar51._28_4_ = auVar51._0_4_;
  auVar53._0_4_ = auVar23._0_4_;
  auVar53._4_4_ = auVar53._0_4_;
  auVar53._8_4_ = auVar53._0_4_;
  auVar53._12_4_ = auVar53._0_4_;
  auVar53._16_4_ = auVar53._0_4_;
  auVar53._20_4_ = auVar53._0_4_;
  auVar53._24_4_ = auVar53._0_4_;
  auVar53._28_4_ = auVar53._0_4_;
  auVar52._0_4_ = auVar26._0_4_;
  auVar52._4_4_ = auVar52._0_4_;
  auVar52._8_4_ = auVar52._0_4_;
  auVar52._12_4_ = auVar52._0_4_;
  auVar52._16_4_ = auVar52._0_4_;
  auVar52._20_4_ = auVar52._0_4_;
  auVar52._24_4_ = auVar52._0_4_;
  auVar52._28_4_ = auVar52._0_4_;
  auVar32._4_4_ = auVar52._0_4_ * bezier_basis0._3948_4_;
  auVar32._0_4_ = auVar52._0_4_ * bezier_basis0._3944_4_;
  auVar32._8_4_ = auVar52._0_4_ * bezier_basis0._3952_4_;
  auVar32._12_4_ = auVar52._0_4_ * bezier_basis0._3956_4_;
  auVar32._16_4_ = auVar52._0_4_ * bezier_basis0._3960_4_;
  auVar32._20_4_ = auVar52._0_4_ * bezier_basis0._3964_4_;
  auVar32._24_4_ = auVar52._0_4_ * bezier_basis0._3968_4_;
  auVar32._28_4_ = bezier_basis0._3972_4_;
  auVar23 = vfmadd231ps_fma(auVar32,auVar53,bezier_basis0._2788_32_);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar51,bezier_basis0._1632_32_);
  auVar43 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar30,bezier_basis0._476_32_);
  auVar29 = vmaxps_avx512vl(auVar29,auVar43);
  auVar32 = vmulps_avx512vl(auVar52,bezier_basis0._8568_32_);
  auVar23 = vfmadd231ps_fma(auVar32,bezier_basis0._7412_32_,auVar53);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),bezier_basis0._6256_32_,auVar51);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),bezier_basis0._5100_32_,auVar30);
  auVar31 = vmulps_avx512vl(ZEXT1632(auVar23),auVar31);
  auVar32 = vblendps_avx(auVar31,ZEXT432(0) << 0x20,1);
  auVar30 = vsubps_avx(auVar43,auVar32);
  auVar32 = vblendps_avx(auVar31,ZEXT432(0) << 0x20,0x80);
  auVar48._0_4_ = auVar43._0_4_ + auVar32._0_4_;
  auVar48._4_4_ = auVar43._4_4_ + auVar32._4_4_;
  auVar48._8_4_ = auVar43._8_4_ + auVar32._8_4_;
  auVar48._12_4_ = auVar43._12_4_ + auVar32._12_4_;
  auVar48._16_4_ = auVar43._16_4_ + auVar32._16_4_;
  auVar48._20_4_ = auVar43._20_4_ + auVar32._20_4_;
  auVar48._24_4_ = auVar43._24_4_ + auVar32._24_4_;
  auVar48._28_4_ = auVar43._28_4_ + auVar32._28_4_;
  auVar32 = vmaxps_avx(auVar30,auVar48);
  auVar32 = vmaxps_avx(auVar29,auVar32);
  auVar49._8_4_ = 0x7f800000;
  auVar49._0_8_ = 0x7f8000007f800000;
  auVar49._12_4_ = 0x7f800000;
  auVar49._16_4_ = 0x7f800000;
  auVar49._20_4_ = 0x7f800000;
  auVar49._24_4_ = 0x7f800000;
  auVar49._28_4_ = 0x7f800000;
  auVar31 = vminps_avx(auVar49,auVar28);
  auVar27 = vminps_avx512vl(auVar27,auVar33);
  auVar31 = vminps_avx(auVar31,auVar27);
  auVar27 = vminps_avx512vl(auVar49,auVar37);
  auVar28 = vminps_avx512vl(auVar35,auVar36);
  auVar27 = vminps_avx(auVar27,auVar28);
  auVar29 = vminps_avx512vl(auVar49,auVar41);
  auVar28 = vminps_avx(auVar39,auVar40);
  auVar28 = vminps_avx(auVar29,auVar28);
  auVar29 = vminps_avx(auVar49,auVar43);
  auVar30 = vminps_avx(auVar30,auVar48);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar30 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar30 = vshufpd_avx(auVar29,auVar29,5);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar23 = vminps_avx(auVar29._0_16_,auVar29._16_16_);
  auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar28,auVar29);
  auVar29 = vshufpd_avx(auVar28,auVar28,5);
  auVar28 = vminps_avx(auVar28,auVar29);
  auVar24 = vminps_avx(auVar28._0_16_,auVar28._16_16_);
  auVar24 = vunpcklps_avx(auVar23,auVar24);
  auVar28 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar27,auVar28);
  auVar28 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vminps_avx(auVar27,auVar28);
  auVar23 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar13 = vinsertps_avx(auVar24,auVar23,0x28);
  auVar27 = vshufps_avx(auVar32,auVar32,0xb1);
  auVar32 = vmaxps_avx(auVar32,auVar27);
  auVar27 = vshufpd_avx(auVar32,auVar32,5);
  auVar32 = vmaxps_avx(auVar32,auVar27);
  auVar23 = vmaxps_avx(auVar32._0_16_,auVar32._16_16_);
  auVar32 = vshufps_avx512vl(auVar42,auVar42,0xb1);
  auVar27 = vmaxps_avx512vl(auVar42,auVar32);
  auVar32 = vshufpd_avx(auVar27,auVar27,5);
  auVar32 = vmaxps_avx(auVar27,auVar32);
  auVar24 = vmaxps_avx(auVar32._0_16_,auVar32._16_16_);
  auVar24 = vunpcklps_avx(auVar23,auVar24);
  auVar32 = vshufps_avx512vl(auVar38,auVar38,0xb1);
  auVar27 = vmaxps_avx512vl(auVar38,auVar32);
  auVar32 = vshufpd_avx(auVar27,auVar27,5);
  auVar32 = vmaxps_avx(auVar27,auVar32);
  auVar23 = vmaxps_avx(auVar32._0_16_,auVar32._16_16_);
  auVar25 = vinsertps_avx(auVar24,auVar23,0x28);
  auVar32 = vshufps_avx(auVar31,auVar31,0xb1);
  auVar32 = vminps_avx(auVar31,auVar32);
  auVar31 = vshufpd_avx(auVar32,auVar32,5);
  auVar32 = vminps_avx(auVar32,auVar31);
  auVar23 = vminss_avx(auVar32._0_16_,auVar32._16_16_);
  auVar32 = vshufps_avx512vl(auVar34,auVar34,0xb1);
  auVar31 = vmaxps_avx512vl(auVar34,auVar32);
  auVar32 = vshufpd_avx(auVar31,auVar31,5);
  auVar32 = vmaxps_avx(auVar31,auVar32);
  auVar24 = vmaxss_avx(auVar32._0_16_,auVar32._16_16_);
  auVar50._8_4_ = 0x7fffffff;
  auVar50._0_8_ = 0x7fffffff7fffffff;
  auVar50._12_4_ = 0x7fffffff;
  auVar23 = vandps_avx(auVar23,auVar50);
  auVar24 = vandps_avx(auVar24,auVar50);
  auVar23 = vmaxss_avx(auVar24,auVar23);
  auVar46._0_4_ = auVar23._0_4_;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar13 = vsubps_avx(auVar13,auVar46);
  auVar44._0_4_ = auVar25._0_4_ + auVar46._0_4_;
  auVar44._4_4_ = auVar25._4_4_ + auVar46._0_4_;
  auVar44._8_4_ = auVar25._8_4_ + auVar46._0_4_;
  auVar44._12_4_ = auVar25._12_4_ + auVar46._0_4_;
  auVar23 = vandps_avx(auVar13,auVar50);
  auVar24 = vandps_avx(auVar44,auVar50);
  auVar23 = vmaxps_avx(auVar23,auVar24);
  auVar24 = vmovshdup_avx(auVar23);
  auVar24 = vmaxss_avx(auVar24,auVar23);
  auVar23 = vshufpd_avx(auVar23,auVar23,1);
  auVar23 = vmaxss_avx(auVar23,auVar24);
  fVar1 = auVar23._0_4_ * 4.7683716e-07;
  auVar47._4_4_ = fVar1;
  auVar47._0_4_ = fVar1;
  auVar47._8_4_ = fVar1;
  auVar47._12_4_ = fVar1;
  aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar13,auVar47);
  (__return_storage_ptr__->lower).field_0 = aVar3;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar44._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar44._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar44._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar44._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }